

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandCexCut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint iFrBeg;
  uint fAllFrames;
  uint fVerbose;
  uint uVar2;
  Aig_Man_t *p;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  
  local_50 = 0;
  Extra_UtilGetoptReset();
  local_54 = 1000000000;
  local_4c = 0;
  fAllFrames = 0;
  fVerbose = 0;
  iFrBeg = 0;
LAB_00273565:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"FGcnmvh"), iVar6 = globalUtilOptind, iVar1 == 0x46) {
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_00273716:
      iVar6 = -1;
      goto LAB_0027371b;
    }
    iFrBeg = atoi(argv[globalUtilOptind]);
    uVar2 = iFrBeg;
joined_r0x00273639:
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar2 < 0) {
LAB_00273722:
      Abc_Print(-2,"usage: cexcut [-FG num] [-cnmvh]\n");
      Abc_Print(-2,"\t         creates logic for bad states using the current CEX\n");
      Abc_Print(-2,"\t-F num : 0-based number of the starting frame [default = %d]\n",(ulong)iFrBeg)
      ;
      Abc_Print(-2,"\t-G num : 0-based number of the ending frame [default = %d]\n",(ulong)local_54)
      ;
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_50 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle outputting unate combinational circuit [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_4c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle generating only one bad state [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fAllFrames == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle generating bad states for all frames after G [default = %s]\n"
                ,pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  if (iVar1 < 0x68) {
    if (iVar1 == -1) {
      if (pAbc->pCex == (Abc_Cex_t *)0x0) {
        pcVar4 = "There is no current cex.\n";
      }
      else {
        pAVar3 = pAbc->pNtkCur;
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "There is no AIG in the &-space.\n";
        }
        else if (pAVar3->ntkType == ABC_NTK_STRASH) {
          if (local_54 == 1000000000) {
            local_54 = pAbc->pCex->iFrame;
          }
          p = Abc_NtkToDar(pAVar3,0,1);
          pMan = Bmc_AigTargetStates(p,pAbc->pCex,iFrBeg,local_54,local_50,local_4c,fAllFrames,
                                     fVerbose);
          Aig_ManStop(p);
          if (pMan != (Aig_Man_t *)0x0) {
            pAVar3 = Abc_NtkFromAigPhase(pMan);
            pcVar4 = Extra_UtilStrsav(pAbc->pNtkCur->pName);
            pAVar3->pName = pcVar4;
            Aig_ManStop(pMan);
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
            return 0;
          }
          pcVar4 = "Command has failed.\n";
        }
        else {
          pcVar4 = "Current network is not an AIG.\n";
        }
      }
      Abc_Print(1,pcVar4);
      return 0;
    }
    if (iVar1 == 0x47) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-G\" should be followed by an integer.\n";
        goto LAB_00273716;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
      goto joined_r0x00273639;
    }
    if (iVar1 == 99) {
      local_50 = local_50 ^ 1;
      goto LAB_00273565;
    }
  }
  else if (iVar1 < 0x6e) {
    if (iVar1 == 0x68) goto LAB_00273722;
    if (iVar1 == 0x6d) {
      fAllFrames = fAllFrames ^ 1;
      goto LAB_00273565;
    }
  }
  else {
    if (iVar1 == 0x6e) {
      local_4c = local_4c ^ 1;
      goto LAB_00273565;
    }
    if (iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
      goto LAB_00273565;
    }
  }
  pcVar4 = "Unknown switch.\n";
  iVar6 = -2;
LAB_0027371b:
  Abc_Print(iVar6,pcVar4);
  goto LAB_00273722;
}

Assistant:

int Abc_CommandCexCut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtkNew;
    int c, iFrStart = 0;
    int iFrStop     = ABC_INFINITY;
    int fCombOnly   = 0;
    int fUseOne     = 0;
    int fAllFrames  = 0;
    int fVerbose    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FGcnmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStop < 0 )
                goto usage;
            break;
        case 'c':
            fCombOnly ^= 1;
            break;
        case 'n':
            fUseOne ^= 1;
            break;
        case 'm':
            fAllFrames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }
    if ( pAbc->pNtkCur == NULL )
    {
        Abc_Print( 1, "There is no AIG in the &-space.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pAbc->pNtkCur) )
    {
        Abc_Print( 1, "Current network is not an AIG.\n");
        return 0;
    }
    if ( iFrStop == ABC_INFINITY )
        iFrStop = pAbc->pCex->iFrame;

    {
        Aig_Man_t * pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        Aig_Man_t * pAigNew = Bmc_AigTargetStates( pAig, pAbc->pCex, iFrStart, iFrStop, fCombOnly, fUseOne, fAllFrames, fVerbose );
        Aig_ManStop( pAig );
        if ( pAigNew == NULL )
        {
            Abc_Print( 1, "Command has failed.\n");
            return 0;
        }
        pNtkNew = Abc_NtkFromAigPhase( pAigNew );
        pNtkNew->pName = Extra_UtilStrsav( pAbc->pNtkCur->pName );
        Aig_ManStop( pAigNew );
        // update the network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    }
/*
    pGiaNew = Bmc_GiaTargetStates( pAbc->pGia, pAbc->pCex, iFrStart, iFrStop, fCombOnly, fUseOne, fVerbose );
    if ( pGiaNew == NULL )
    {
        Abc_Print( 1, "Command has failed.\n");
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pGiaNew );
*/
    return 0;

usage:
    Abc_Print( -2, "usage: cexcut [-FG num] [-cnmvh]\n" );
    Abc_Print( -2, "\t         creates logic for bad states using the current CEX\n" );
    Abc_Print( -2, "\t-F num : 0-based number of the starting frame [default = %d]\n", iFrStart );
    Abc_Print( -2, "\t-G num : 0-based number of the ending frame [default = %d]\n",   iFrStop );
    Abc_Print( -2, "\t-c     : toggle outputting unate combinational circuit [default = %s]\n",  fCombOnly? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle generating only one bad state [default = %s]\n", fUseOne? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle generating bad states for all frames after G [default = %s]\n", fAllFrames? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}